

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

void __thiscall
testing::internal::
CartesianProductGenerator<const_libaom_test::CodecFactory_*,_(anonymous_namespace)::TestVideoParam,_(anonymous_namespace)::TestEncodeParam,_int>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_>::Advance
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL,_2UL,_3UL>_> *this)

{
  ParamIterator<int> *in_RDI;
  
  std::
  get<3ul,testing::internal::ParamIterator<libaom_test::CodecFactory_const*>,testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,testing::internal::ParamIterator<int>>
            ((tuple<testing::internal::ParamIterator<const_libaom_test::CodecFactory_*>,_testing::internal::ParamIterator<(anonymous_namespace)::TestVideoParam>,_testing::internal::ParamIterator<(anonymous_namespace)::TestEncodeParam>,_testing::internal::ParamIterator<int>_>
              *)0x92bbdc);
  ParamIterator<int>::operator++(in_RDI);
  CartesianProductGenerator<libaom_test::CodecFactory_const*,(anonymous_namespace)::TestVideoParam,(anonymous_namespace)::TestEncodeParam,int>
  ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul,2ul,3ul>>::AdvanceIfEnd<3ul>(this);
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }